

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

int open_tmp_file(char **out_path,char *ext,uint ext_len)

{
  size_t sVar1;
  int iVar2;
  char *__s;
  size_t __size;
  char *__s_00;
  ulong uVar3;
  str_t local_48;
  
  local_48.name = (char *)0x0;
  local_48.size = 0;
  uVar3 = (ulong)(ext_len + 1);
  if (ext_len == 0) {
    uVar3 = 0;
  }
  get_sys_temp_dir(&local_48);
  sVar1 = local_48.size;
  __size = uVar3 + local_48.size + 0x14;
  __s = (char *)calloc(1,__size);
  if (__s == (char *)0x0) {
    perror("malloc");
    iVar2 = -1;
    goto LAB_0010320a;
  }
  if ((int)uVar3 == 0) {
    snprintf(__s,__size,"%.*s%cchrome_bee_XXXXXXXX",sVar1 & 0xffffffff,local_48.name,0x2f);
    iVar2 = mkstemp(__s);
    if (iVar2 == -1) {
      __s_00 = "mktemp";
LAB_001032d3:
      perror(__s_00);
      iVar2 = -1;
    }
  }
  else {
    snprintf(__s,__size,"%.*s%cchrome_bee_XXXXXXXX.%.*s",sVar1 & 0xffffffff,local_48.name,0x2f,
             (ulong)ext_len,ext);
    fprintf(_stderr,
            "%s: tmp_file_template = \"%s\" tmp_file_template_size = %lu suffix_len = (%u) ext = (%s) ext_len = %u\n"
            ,"open_tmp_file",__s,__size,uVar3,ext,(ulong)ext_len);
    iVar2 = mkstemps(__s,(int)uVar3);
    if (iVar2 == -1) {
      __s_00 = "mktemps";
      goto LAB_001032d3;
    }
  }
  *out_path = __s;
LAB_0010320a:
  if (local_48.name != (char *)0x0) {
    free(local_48.name);
  }
  if (__s != (char *)0x0 && iVar2 == -1) {
    free(__s);
  }
  return iVar2;
}

Assistant:

int
open_tmp_file (char **out_path, const char* ext, unsigned ext_len)
{
  int fd = -1;
  str_t tmp_dir = { 0 };
  size_t tmp_file_template_size = 0;
  char *tmp_file_template = NULL;
  const unsigned suffix_len = ext_len ? 1 + ext_len : 0;

  if (unlikely (get_sys_temp_dir (&tmp_dir) == NULL))
    {
      perror ("get_sys_temp_dir");
      return -1;
    }

  tmp_file_template_size = (tmp_dir.size - 1) +
    DIR_SEPARATOR_LEN + sizeof (TMP_FILENAME_TEMPLATE) + suffix_len;

  tmp_file_template = malloc (tmp_file_template_size);
  if (unlikely (tmp_file_template == NULL))
    {
      perror ("malloc");
      goto _ret;
    }
  memset (tmp_file_template, 0, tmp_file_template_size);

  if (suffix_len)
    {
      snprintf (tmp_file_template, tmp_file_template_size,
                "%.*s%c" TMP_FILENAME_TEMPLATE ".%.*s",
                (int)tmp_dir.size, tmp_dir.name, DIR_SEPARATOR, ext_len, ext);
      elog_debug ("%s: tmp_file_template = \"%s\" "
                  "tmp_file_template_size = %lu "
                  "suffix_len = (%u) "
                  "ext = (%s) "
                  "ext_len = %u\n",
                 __func__,
                 tmp_file_template,
                 tmp_file_template_size,
                 suffix_len,
                 ext,
                 ext_len);

      fd = mkstemps (tmp_file_template, suffix_len);
      if (fd == -1)
        perror("mktemps");
    }
  else
    {
      snprintf (tmp_file_template, tmp_file_template_size,
                "%.*s%c" TMP_FILENAME_TEMPLATE,
                (int)tmp_dir.size, tmp_dir.name, DIR_SEPARATOR);

      fd = mkstemp (tmp_file_template);
      if (fd == -1)
        perror("mktemp");
    }

  *out_path = tmp_file_template;

_ret:
  str_destroy (&tmp_dir);

  if (fd == -1)
    {
      if (tmp_file_template != NULL)
        free (tmp_file_template);
    }

  return fd;
}